

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * __thiscall
QPDF::getKeyForObject_abi_cxx11_
          (string *__return_storage_ptr__,QPDF *this,shared_ptr<QPDF::EncryptionParameters> *encp,
          QPDFObjGen og,bool use_aes)

{
  int encryption_V;
  byte bVar1;
  bool bVar2;
  int objid;
  int generation;
  element_type *peVar3;
  logic_error *this_00;
  element_type *peVar4;
  string local_58;
  byte local_21;
  QPDF *pQStack_20;
  bool use_aes_local;
  shared_ptr<QPDF::EncryptionParameters> *encp_local;
  QPDFObjGen og_local;
  
  local_21 = (byte)og.obj & 1;
  pQStack_20 = this;
  encp_local = encp;
  og_local = (QPDFObjGen)__return_storage_ptr__;
  peVar3 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  if ((peVar3->encrypted & 1U) != 0) {
    peVar3 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    bVar2 = QPDFObjGen::operator!=((QPDFObjGen *)&encp_local,&peVar3->cached_key_og);
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      objid = QPDFObjGen::getObj((QPDFObjGen *)&encp_local);
      generation = QPDFObjGen::getGen((QPDFObjGen *)&encp_local);
      bVar1 = local_21;
      peVar4 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      encryption_V = peVar4->encryption_V;
      peVar4 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      compute_data_key(&local_58,&peVar3->encryption_key,objid,generation,(bool)(bVar1 & 1),
                       encryption_V,peVar4->encryption_R);
      peVar3 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=
                ((string *)&peVar3->cached_object_encryption_key,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      peVar3 = std::
               __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar3->cached_key_og = (QPDFObjGen)encp_local;
    }
    peVar3 = std::
             __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&peVar3->cached_object_encryption_key);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"request for encryption key in non-encrypted PDF");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
QPDF::getKeyForObject(std::shared_ptr<EncryptionParameters> encp, QPDFObjGen og, bool use_aes)
{
    if (!encp->encrypted) {
        throw std::logic_error("request for encryption key in non-encrypted PDF");
    }

    if (og != encp->cached_key_og) {
        encp->cached_object_encryption_key = compute_data_key(
            encp->encryption_key,
            og.getObj(),
            og.getGen(),
            use_aes,
            encp->encryption_V,
            encp->encryption_R);
        encp->cached_key_og = og;
    }

    return encp->cached_object_encryption_key;
}